

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

void __thiscall
duckdb::BatchInsertGlobalState::ScheduleMergeTasks
          (BatchInsertGlobalState *this,ClientContext *context,idx_t min_batch_index)

{
  vector<duckdb::RowGroupBatchEntry,_true> *this_00;
  ulong uVar1;
  idx_t iVar2;
  pointer pRVar3;
  pointer pRVar4;
  _func_int **pp_Var5;
  iterator iVar6;
  RowGroupBatchEntry *pRVar7;
  bool bVar8;
  int iVar9;
  reference pvVar10;
  undefined4 extraout_var;
  RowGroupCollection *this_01;
  reference pvVar11;
  reference pvVar12;
  long lVar13;
  long lVar14;
  InternalException *this_02;
  size_t __n;
  pointer pBVar15;
  ulong uVar16;
  pointer pRVar17;
  size_type __n_00;
  vector<duckdb::BatchMergeTask,_true> to_be_scheduled_tasks;
  BatchMergeTask current_task;
  RowGroupBatchEntry added_entry;
  vector<duckdb::BatchMergeTask,_true> local_d8;
  BatchMergeTask local_b8;
  _Head_base<0UL,_duckdb::BatchInsertTask_*,_false> local_a0;
  _func_int **local_98;
  iterator iStack_90;
  RowGroupBatchEntry *local_88;
  undefined1 local_80 [32];
  RowGroupBatchType local_60;
  uint7 uStack_5f;
  _func_int **local_58;
  BatchTaskManager<duckdb::BatchInsertTask> *local_50;
  BatchMergeTask *local_48;
  _func_int **local_40;
  ClientContext *local_38;
  
  local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_start = (BatchMergeTask *)0x0;
  local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (BatchMergeTask *)0x0;
  local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
  super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (BatchMergeTask *)0x0;
  uVar16 = this->next_start;
  local_b8.end_index = 0;
  local_b8.total_count = 0;
  this_00 = &this->collections;
  local_b8.start_index = uVar16;
  local_38 = context;
  if (uVar16 < (ulong)(((long)(this->collections).
                              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              .
                              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->collections).
                              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              .
                              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)
     ) {
    do {
      pvVar10 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,uVar16);
      uVar1 = pvVar10->batch_idx;
      if (min_batch_index < uVar1) {
        bVar8 = ReadyToMerge(this,local_b8.total_count);
        if (bVar8) {
          if (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_b8.end_index = uVar16;
            ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
            _M_realloc_insert<duckdb::BatchMergeTask_const&>
                      ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                       &local_d8,
                       (iterator)
                       local_d8.
                       super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       .
                       super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          }
          else {
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->total_count = local_b8.total_count;
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start_index = local_b8.start_index;
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end_index = uVar16;
            local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_d8.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8.end_index = uVar16;
          }
        }
      }
      else {
        if (pvVar10->type == FLUSHED) {
          if (local_b8.total_count != 0) {
            if (local_d8.
                super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_d8.
                super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_b8.end_index = uVar16;
              ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
              _M_realloc_insert<duckdb::BatchMergeTask_const&>
                        ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                         &local_d8,
                         (iterator)
                         local_d8.
                         super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                         .
                         super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
            }
            else {
              (local_d8.
               super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               _M_impl.super__Vector_impl_data._M_finish)->total_count = local_b8.total_count;
              (local_d8.
               super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               _M_impl.super__Vector_impl_data._M_finish)->start_index = local_b8.start_index;
              (local_d8.
               super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
               _M_impl.super__Vector_impl_data._M_finish)->end_index = uVar16;
              local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_d8.
                   super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                   super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              local_b8.end_index = uVar16;
            }
          }
          if (this->next_start <= uVar16) {
            this->next_start = uVar16 + 1;
          }
        }
        else {
          local_b8.total_count = local_b8.total_count + pvVar10->total_rows;
          bVar8 = ReadyToMerge(this,local_b8.total_count);
          if (!bVar8) goto LAB_01586260;
          local_b8.end_index = uVar16 + 1;
          if (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>>::
            _M_realloc_insert<duckdb::BatchMergeTask_const&>
                      ((vector<duckdb::BatchMergeTask,std::allocator<duckdb::BatchMergeTask>> *)
                       &local_d8,
                       (iterator)
                       local_d8.
                       super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       .
                       super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
          }
          else {
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->total_count = local_b8.total_count;
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->start_index = local_b8.start_index;
            (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish)->end_index = local_b8.end_index;
            local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_d8.
                 super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                 super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        local_b8.start_index = uVar16 + 1;
        local_b8.total_count = 0;
      }
LAB_01586260:
    } while ((uVar1 <= min_batch_index) &&
            (uVar16 = uVar16 + 1,
            uVar16 < (ulong)(((long)(this->collections).
                                    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                    .
                                    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->collections).
                                    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                    .
                                    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333)));
  }
  local_48 = local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = &this->task_manager;
    local_58 = (_func_int **)&PTR__MergeCollectionTask_024a0770;
    pBVar15 = local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pvVar10 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,pBVar15->start_index);
      local_40 = (_func_int **)pvVar10->batch_idx;
      local_98 = (_func_int **)0x0;
      iStack_90._M_current = (RowGroupBatchEntry *)0x0;
      local_88 = (RowGroupBatchEntry *)0x0;
      for (uVar16 = pBVar15->start_index; uVar16 < pBVar15->end_index; uVar16 = uVar16 + 1) {
        pvVar10 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,uVar16);
        if (((pvVar10->collection_index).index == 0xffffffffffffffff) || (pvVar10->type == FLUSHED))
        {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_80._0_8_ = local_80 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_80,"Adding a row group collection that should not be flushed",
                     "");
          InternalException::InternalException(this_02,(string *)local_80);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar9 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                  super_CatalogEntry._vptr_CatalogEntry[0x10])();
        this_01 = DataTable::GetOptimisticCollection
                            ((DataTable *)CONCAT44(extraout_var,iVar9),local_38,
                             (PhysicalIndex)(pvVar10->collection_index).index);
        pvVar11 = vector<duckdb::RowGroupBatchEntry,_true>::operator[](this_00,pBVar15->start_index)
        ;
        local_80._0_8_ = pvVar11->batch_idx;
        iVar2 = (pvVar10->collection_index).index;
        local_80._8_8_ = RowGroupCollection::GetTotalRows(this_01);
        local_60 = FLUSHED;
        local_80._16_8_ = pvVar10->unflushed_memory;
        local_80._24_8_ = iVar2;
        if (iStack_90._M_current == local_88) {
          ::std::vector<duckdb::RowGroupBatchEntry,std::allocator<duckdb::RowGroupBatchEntry>>::
          _M_realloc_insert<duckdb::RowGroupBatchEntry_const&>
                    ((vector<duckdb::RowGroupBatchEntry,std::allocator<duckdb::RowGroupBatchEntry>>
                      *)&local_98,iStack_90,(RowGroupBatchEntry *)local_80);
        }
        else {
          *(ulong *)&(iStack_90._M_current)->type = (ulong)uStack_5f << 8;
          local_80._20_4_ = (undefined4)((ulong)local_80._16_8_ >> 0x20);
          local_80._24_4_ = (undefined4)iVar2;
          local_80._28_4_ = (undefined4)(iVar2 >> 0x20);
          *(undefined4 *)&(iStack_90._M_current)->unflushed_memory = local_80._16_4_;
          *(undefined4 *)((long)&(iStack_90._M_current)->unflushed_memory + 4) = local_80._20_4_;
          *(undefined4 *)&((iStack_90._M_current)->collection_index).index = local_80._24_4_;
          *(undefined4 *)((long)&((iStack_90._M_current)->collection_index).index + 4) =
               local_80._28_4_;
          (iStack_90._M_current)->batch_idx = local_80._0_8_;
          (iStack_90._M_current)->total_rows = local_80._8_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        pvVar10->total_rows = pBVar15->total_count;
        pvVar10->type = FLUSHED;
        (pvVar10->collection_index).index = 0xffffffffffffffff;
      }
      local_a0._M_head_impl = (BatchInsertTask *)operator_new(0x28);
      pRVar7 = local_88;
      iVar6._M_current = iStack_90._M_current;
      pp_Var5 = local_98;
      local_98 = (_func_int **)0x0;
      iStack_90._M_current = (RowGroupBatchEntry *)0x0;
      local_88 = (RowGroupBatchEntry *)0x0;
      (local_a0._M_head_impl)->_vptr_BatchInsertTask = local_58;
      local_a0._M_head_impl[1]._vptr_BatchInsertTask = pp_Var5;
      local_a0._M_head_impl[2]._vptr_BatchInsertTask = (_func_int **)iVar6._M_current;
      local_a0._M_head_impl[3]._vptr_BatchInsertTask = (_func_int **)pRVar7;
      local_a0._M_head_impl[4]._vptr_BatchInsertTask = local_40;
      BatchTaskManager<duckdb::BatchInsertTask>::AddTask
                (local_50,(unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>
                           *)&local_a0);
      if (local_a0._M_head_impl != (BatchInsertTask *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_BatchInsertTask[1])();
      }
      local_a0._M_head_impl = (BatchInsertTask *)0x0;
      if (local_98 != (_func_int **)0x0) {
        operator_delete(local_98);
      }
      pBVar15 = pBVar15 + 1;
    } while (pBVar15 != local_48);
    if ((long)local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
              .super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      __n_00 = ((long)local_d8.
                      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      do {
        __n_00 = __n_00 - 1;
        pvVar12 = vector<duckdb::BatchMergeTask,_true>::operator[](&local_d8,__n_00);
        if (pvVar12->start_index + 1 < pvVar12->end_index) {
          pRVar17 = (this_00->
                    super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                    ).
                    super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar12->start_index);
          pRVar3 = (this_00->
                   super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ).
                   super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar14 = NumericCastImpl<long,_unsigned_long,_false>::Convert(pvVar12->end_index);
          pRVar17 = pRVar17 + lVar13 + 1;
          pRVar3 = pRVar3 + lVar14;
          if (pRVar17 != pRVar3) {
            __n = (long)(this->collections).
                        super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        .
                        super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3;
            if (__n != 0) {
              memmove(pRVar17,pRVar3,__n);
            }
            pRVar4 = (this->collections).
                     super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                     .
                     super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pRVar17 = (pointer)((long)pRVar17 + ((long)pRVar4 - (long)pRVar3));
            if (pRVar4 != pRVar17) {
              (this->collections).
              super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
              super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish = pRVar17;
            }
          }
        }
      } while (__n_00 != 0);
    }
  }
  if (local_d8.super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
      super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>._M_impl.
      super__Vector_impl_data._M_start != (BatchMergeTask *)0x0) {
    operator_delete(local_d8.
                    super_vector<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>.
                    super__Vector_base<duckdb::BatchMergeTask,_std::allocator<duckdb::BatchMergeTask>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BatchInsertGlobalState::ScheduleMergeTasks(ClientContext &context, const idx_t min_batch_index) {
	idx_t current_idx;
	vector<BatchMergeTask> to_be_scheduled_tasks;

	BatchMergeTask current_task(next_start);
	for (current_idx = current_task.start_index; current_idx < collections.size(); current_idx++) {
		auto &entry = collections[current_idx];
		if (entry.batch_idx > min_batch_index) {
			// this entry is AFTER the min_batch_index
			// finished
			if (ReadyToMerge(current_task.total_count)) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			break;
		}
		if (entry.type == RowGroupBatchType::FLUSHED) {
			// already flushed: cannot flush anything here
			if (current_task.total_count > 0) {
				current_task.end_index = current_idx;
				to_be_scheduled_tasks.push_back(current_task);
			}
			current_task.start_index = current_idx + 1;
			if (current_task.start_index > next_start) {
				// avoid checking this segment again in the future
				next_start = current_task.start_index;
			}
			current_task.total_count = 0;
			continue;
		}
		// not flushed - add to set of indexes to flush
		current_task.total_count += entry.total_rows;
		if (ReadyToMerge(current_task.total_count)) {
			// create a task to merge these collections
			current_task.end_index = current_idx + 1;
			to_be_scheduled_tasks.push_back(current_task);
			current_task.start_index = current_idx + 1;
			current_task.total_count = 0;
		}
	}

	if (to_be_scheduled_tasks.empty()) {
		return;
	}
	for (auto &scheduled_task : to_be_scheduled_tasks) {
		D_ASSERT(scheduled_task.total_count > 0);
		D_ASSERT(current_idx > scheduled_task.start_index);
		auto merged_batch_index = collections[scheduled_task.start_index].batch_idx;
		vector<RowGroupBatchEntry> merge_collections;
		for (idx_t idx = scheduled_task.start_index; idx < scheduled_task.end_index; idx++) {
			auto &entry = collections[idx];
			if (!entry.collection_index.IsValid() || entry.type == RowGroupBatchType::FLUSHED) {
				throw InternalException("Adding a row group collection that should not be flushed");
			}
			auto &collection = table.GetStorage().GetOptimisticCollection(context, entry.collection_index);
			RowGroupBatchEntry added_entry(collection, collections[scheduled_task.start_index].batch_idx,
			                               entry.collection_index, RowGroupBatchType::FLUSHED);
			added_entry.unflushed_memory = entry.unflushed_memory;
			merge_collections.push_back(added_entry);
			entry.total_rows = scheduled_task.total_count;
			entry.type = RowGroupBatchType::FLUSHED;
			entry.collection_index = PhysicalIndex(DConstants::INVALID_INDEX);
		}
		task_manager.AddTask(make_uniq<MergeCollectionTask>(std::move(merge_collections), merged_batch_index));
	}
	// erase in reverse order
	for (idx_t i = to_be_scheduled_tasks.size(); i > 0; i--) {
		auto &scheduled_task = to_be_scheduled_tasks[i - 1];
		if (scheduled_task.start_index + 1 < scheduled_task.end_index) {
			// erase all entries except the first one
			collections.erase(collections.begin() + NumericCast<int64_t>(scheduled_task.start_index) + 1,
			                  collections.begin() + NumericCast<int64_t>(scheduled_task.end_index));
		}
	}
}